

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

void __thiscall flatbuffers::ts::TsGenerator::generateEntry(TsGenerator *this)

{
  bool bVar1;
  size_type sVar2;
  Namespace *this_00;
  mapped_type *this_01;
  char *pcVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>_>_>
  *this_02;
  const_iterator cVar4;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  bVar5;
  const_iterator __last;
  size_type_conflict sVar6;
  size_type_conflict sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  undefined1 local_500 [8];
  string rel_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  undefined1 local_4a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ts_file_path_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>
  *it2;
  iterator __end3_1;
  iterator __begin3_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
  *__range3_1;
  size_type_conflict child_ns_level;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  allocator<char> local_411;
  undefined1 local_410 [8];
  string import_extension;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  StructDef *local_390;
  StructDef *is_struct;
  string fully_qualified_type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ts_file_path_rel;
  allocator<char> local_301;
  undefined1 local_300 [8];
  string base_name_rel;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ts_file_path;
  undefined1 local_2a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> base_name;
  string base_file_name;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_220;
  undefined1 local_218 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rel_components;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>
  *def;
  const_iterator __end3;
  const_iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>_>_>
  *__range3;
  int export_counter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  reference local_158;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>
  *it;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  NsDefinition nsDef;
  undefined1 local_50 [8];
  string root;
  string code;
  TsGenerator *this_local;
  
  std::__cxx11::string::string((string *)(root.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_50);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
          ::count(&this->ns_defs_,(key_type *)local_50);
  if (sVar2 == 0) {
    anon_unknown_10::NsDefinition::NsDefinition((NsDefinition *)local_f8);
    std::__cxx11::string::operator=((string *)local_f8,(string *)local_50);
    std::__cxx11::string::operator=
              ((string *)(nsDef.filepath.field_2._M_local_buf + 8),
               (string *)(this->super_BaseGenerator).file_name_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                   (this->super_BaseGenerator).path_,(this->super_BaseGenerator).file_name_);
    std::operator+(&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                   ".ts");
    std::__cxx11::string::operator=
              ((string *)(nsDef.path.field_2._M_local_buf + 8),(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&__range2);
    this_00 = (Namespace *)operator_new(0x20);
    Namespace::Namespace(this_00);
    nsDef.symbolic_name.field_2._8_8_ = this_00;
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
              ::operator[](&this->ns_defs_,(key_type *)local_f8);
    anon_unknown_10::NsDefinition::operator=(this_01,(NsDefinition *)local_f8);
    anon_unknown_10::NsDefinition::~NsDefinition((NsDefinition *)local_f8);
  }
  __end2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
           ::begin(&this->ns_defs_);
  it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
          ::end(&this->ns_defs_);
  while (bVar1 = std::operator!=(&__end2,(_Self *)&it), bVar1) {
    local_158 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>
                ::operator*(&__end2);
    pcVar3 = BaseGenerator::FlatBuffersGeneratedWarning();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&export_counter,pcVar3,(allocator<char> *)((long)&__range3 + 7));
    std::operator+(&local_1b8,"// ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &export_counter);
    std::operator+(&local_198,&local_1b8,"\n\n");
    std::operator+(&local_178,&local_198,
                   "/* eslint-disable @typescript-eslint/no-unused-vars, @typescript-eslint/no-explicit-any, @typescript-eslint/no-non-null-assertion */\n\n"
                  );
    std::__cxx11::string::operator=((string *)(root.field_2._M_local_buf + 8),(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&export_counter);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
    __range3._0_4_ = 0;
    this_02 = &(local_158->second).definitions;
    __end3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>_>_>
             ::begin(this_02);
    def = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>_>_>
             ::end(this_02);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&def), bVar1) {
      rel_components.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           &std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>_>
            ::operator*(&__end3)->first;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_218);
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&((local_158->second).ns)->components);
      if (sVar6 < 2) {
        cVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(&((local_158->second).ns)->components);
        __last = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&((local_158->second).ns)->components);
        bVar5 = std::
                back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_218);
        std::
        copy<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )cVar4._M_current,
                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )__last._M_current,bVar5);
      }
      else {
        local_228._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&((local_158->second).ns)->components);
        local_220 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator+(&local_228,1);
        cVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(&((local_158->second).ns)->components);
        bVar5 = std::
                back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_218);
        std::
        copy<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (local_220,
                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )cVar4._M_current,bVar5);
      }
      Namer::File<flatbuffers::Definition>
                ((string *)((long)&base_name.field_2 + 8),&(this->namer_).super_Namer,
                 *(Definition **)
                  (rel_components.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 1),SuffixAndExtension);
      Namer::Directories((string *)((long)&ts_file_path.field_2 + 8),&(this->namer_).super_Namer,
                         &((local_158->second).ns)->components,OutputPath,kUpperCamel);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&ts_file_path.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&base_name.field_2 + 8));
      std::__cxx11::string::~string((string *)(ts_file_path.field_2._M_local_buf + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&base_name_rel.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                     ".ts");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_300,"./",&local_301);
      std::allocator<char>::~allocator(&local_301);
      Namer::Directories((string *)((long)&ts_file_path_rel.field_2 + 8),&(this->namer_).super_Namer
                         ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_218,OutputPath,kUpperCamel);
      std::__cxx11::string::operator+=
                ((string *)local_300,(string *)(ts_file_path_rel.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(ts_file_path_rel.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=
                ((string *)local_300,(string *)(base_name.field_2._M_local_buf + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&type_name.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300,
                     ".ts");
      std::__cxx11::string::string
                ((string *)(fully_qualified_type_name.field_2._M_local_buf + 8),
                 (string *)
                 rel_components.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Namespace::GetFullyQualifiedName
                ((string *)&is_struct,(local_158->second).ns,
                 (string *)((long)&fully_qualified_type_name.field_2 + 8),1000);
      local_390 = SymbolTable<flatbuffers::StructDef>::Lookup
                            (&((this->super_BaseGenerator).parser_)->structs_,(string *)&is_struct);
      std::operator+(&local_3b0,"export { ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&fully_qualified_type_name.field_2 + 8));
      std::__cxx11::string::operator+=
                ((string *)(root.field_2._M_local_buf + 8),(string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      if ((((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api & 1U) != 0) &&
         (local_390 != (StructDef *)0x0)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&import_extension.field_2 + 8),", ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&fully_qualified_type_name.field_2 + 8));
        std::operator+(&local_3d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&import_extension.field_2 + 8),
                       &(((this->super_BaseGenerator).parser_)->opts).object_suffix);
        std::__cxx11::string::operator+=
                  ((string *)(root.field_2._M_local_buf + 8),(string *)&local_3d0);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::~string((string *)(import_extension.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::operator+=((string *)(root.field_2._M_local_buf + 8)," } from \'");
      pcVar3 = ".js";
      if (((((this->super_BaseGenerator).parser_)->opts).ts_no_import_ext & 1U) != 0) {
        pcVar3 = "";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_410,pcVar3,&local_411);
      std::allocator<char>::~allocator(&local_411);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &child_ns_level,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410)
      ;
      std::operator+(&local_438,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &child_ns_level,"\';\n");
      std::__cxx11::string::operator+=
                ((string *)(root.field_2._M_local_buf + 8),(string *)&local_438);
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::~string((string *)&child_ns_level);
      __range3._0_4_ = (int)__range3 + 1;
      std::__cxx11::string::~string((string *)local_410);
      std::__cxx11::string::~string((string *)&is_struct);
      std::__cxx11::string::~string((string *)(fully_qualified_type_name.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(type_name.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_300);
      std::__cxx11::string::~string((string *)(base_name_rel.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_2a0);
      std::__cxx11::string::~string((string *)(base_name.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_218);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>_>
      ::operator++(&__end3);
    }
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&((local_158->second).ns)->components);
    __end3_1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
               ::begin(&this->ns_defs_);
    it2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
             ::end(&this->ns_defs_);
    while (bVar1 = std::operator!=(&__end3_1,(_Self *)&it2), bVar1) {
      ts_file_path_1.field_2._8_8_ =
           std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>
           ::operator*(&__end3_1);
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&((((reference)ts_file_path_1.field_2._8_8_)->second).ns)->components);
      if (sVar7 == sVar6 + 1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (ts_file_path_1.field_2._8_8_ + 0x20),".ts");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&rel_path.field_2 + 8),"export * as ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (ts_file_path_1.field_2._8_8_ + 0x60));
        std::operator+(&local_4c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&rel_path.field_2 + 8)," from \'./");
        std::__cxx11::string::operator+=
                  ((string *)(root.field_2._M_local_buf + 8),(string *)&local_4c0);
        std::__cxx11::string::~string((string *)&local_4c0);
        std::__cxx11::string::~string((string *)(rel_path.field_2._M_local_buf + 8));
        std::__cxx11::string::string
                  ((string *)local_500,(string *)(ts_file_path_1.field_2._8_8_ + 0x20));
        std::operator+(&local_520,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_500,".js\';\n");
        std::__cxx11::string::operator+=
                  ((string *)(root.field_2._M_local_buf + 8),(string *)&local_520);
        std::__cxx11::string::~string((string *)&local_520);
        __range3._0_4_ = (int)__range3 + 1;
        std::__cxx11::string::~string((string *)local_500);
        std::__cxx11::string::~string((string *)local_4a0);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>
      ::operator++(&__end3_1);
    }
    if (0 < (int)__range3) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      SaveFile(pcVar3,(string *)((long)&root.field_2 + 8),false);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>
    ::operator++(&__end2);
  }
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(root.field_2._M_local_buf + 8));
  return;
}

Assistant:

void generateEntry() {
    std::string code;

    // add root namespace def if not already existing from defs tracking
    std::string root;
    if (ns_defs_.count(root) == 0) {
      NsDefinition nsDef;
      nsDef.path = root;
      nsDef.symbolic_name = file_name_;
      nsDef.filepath = path_ + file_name_ + ".ts";
      nsDef.ns = new Namespace();
      ns_defs_[nsDef.path] = nsDef;
    }

    for (const auto &it : ns_defs_) {
      code = "// " + std::string(FlatBuffersGeneratedWarning()) + "\n\n" +
        "/* eslint-disable @typescript-eslint/no-unused-vars, @typescript-eslint/no-explicit-any, @typescript-eslint/no-non-null-assertion */\n\n";
      
      // export all definitions in ns entry point module
      int export_counter = 0;
      for (const auto &def : it.second.definitions) {
        std::vector<std::string> rel_components;
        // build path for root level vs child level
        if (it.second.ns->components.size() > 1)
          std::copy(it.second.ns->components.begin() + 1,
                    it.second.ns->components.end(),
                    std::back_inserter(rel_components));
        else
          std::copy(it.second.ns->components.begin(),
                    it.second.ns->components.end(),
                    std::back_inserter(rel_components));
        auto base_file_name =
            namer_.File(*(def.second), SkipFile::SuffixAndExtension);
        auto base_name =
            namer_.Directories(it.second.ns->components, SkipDir::OutputPath) +
            base_file_name;
        auto ts_file_path = base_name + ".ts";
        auto base_name_rel = std::string("./");
        base_name_rel +=
            namer_.Directories(rel_components, SkipDir::OutputPath);
        base_name_rel += base_file_name;
        auto ts_file_path_rel = base_name_rel + ".ts";
        auto type_name = def.first;
        auto fully_qualified_type_name =
            it.second.ns->GetFullyQualifiedName(type_name);
        auto is_struct = parser_.structs_.Lookup(fully_qualified_type_name);
        code += "export { " + type_name;
        if (parser_.opts.generate_object_based_api && is_struct) {
          code += ", " + type_name + parser_.opts.object_suffix;
        }
        code += " } from '";
        std::string import_extension =
            parser_.opts.ts_no_import_ext ? "" : ".js";
        code += base_name_rel + import_extension + "';\n";
        export_counter++;
      }

      // re-export child namespace(s) in parent
      const auto child_ns_level = it.second.ns->components.size() + 1;
      for (const auto &it2 : ns_defs_) {
        if (it2.second.ns->components.size() != child_ns_level) continue;
        auto ts_file_path = it2.second.path + ".ts";
        code += "export * as " + it2.second.symbolic_name + " from './";
        std::string rel_path = it2.second.path;
        code += rel_path + ".js';\n";
        export_counter++;
      }

      if (export_counter > 0) SaveFile(it.second.filepath.c_str(), code, false);
    }
  }